

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

size_t MuxImageDiskSize(WebPMuxImage *wpi)

{
  size_t size;
  size_t sVar1;
  WebPChunk *pWVar2;
  long lVar3;
  
  if (wpi->header == (WebPChunk *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (ulong)((int)(wpi->header->data).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->alpha != (WebPChunk *)0x0) {
    sVar1 = sVar1 + ((int)(wpi->alpha->data).size + 1U & 0xfffffffe) + 8;
  }
  if (wpi->img != (WebPChunk *)0x0) {
    sVar1 = sVar1 + ((int)(wpi->img->data).size + 1U & 0xfffffffe) + 8;
  }
  pWVar2 = wpi->unknown;
  if (pWVar2 != (WebPChunk *)0x0) {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)((int)(pWVar2->data).size + 1U & 0xfffffffe) + 8;
      pWVar2 = pWVar2->next;
    } while (pWVar2 != (WebPChunk *)0x0);
    sVar1 = sVar1 + lVar3;
  }
  return sVar1;
}

Assistant:

size_t MuxImageDiskSize(const WebPMuxImage* const wpi) {
  size_t size = 0;
  if (wpi->header != NULL) size += ChunkDiskSize(wpi->header);
  if (wpi->alpha != NULL) size += ChunkDiskSize(wpi->alpha);
  if (wpi->img != NULL) size += ChunkDiskSize(wpi->img);
  if (wpi->unknown != NULL) size += ChunkListDiskSize(wpi->unknown);
  return size;
}